

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

void normalizePublicId(XML_Char *publicId)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  XML_Char *p;
  
  pbVar2 = (byte *)publicId;
  pbVar3 = (byte *)publicId;
  do {
    bVar4 = *pbVar3;
    if (bVar4 < 0xd) {
      if (bVar4 == 10) goto LAB_0016df1a;
      if (bVar4 == 0) {
        if ((pbVar2 != (byte *)publicId) &&
           (publicId = (XML_Char *)(pbVar2 + -1), pbVar2[-1] != 0x20)) {
          publicId = (XML_Char *)pbVar2;
        }
        *publicId = 0;
        return;
      }
LAB_0016df30:
      *pbVar2 = bVar4;
      pbVar1 = pbVar2 + 1;
    }
    else {
      if ((bVar4 != 0x20) && (bVar4 != 0xd)) goto LAB_0016df30;
LAB_0016df1a:
      pbVar1 = (byte *)publicId;
      if ((pbVar2 != (byte *)publicId) && (bVar4 = 0x20, pbVar1 = pbVar2, pbVar2[-1] != 0x20))
      goto LAB_0016df30;
    }
    pbVar2 = pbVar1;
    pbVar3 = pbVar3 + 1;
  } while( true );
}

Assistant:

static void FASTCALL
normalizePublicId(XML_Char *publicId) {
  XML_Char *p = publicId;
  XML_Char *s;
  for (s = publicId; *s; s++) {
    switch (*s) {
    case 0x20:
    case 0xD:
    case 0xA:
      if (p != publicId && p[-1] != 0x20)
        *p++ = 0x20;
      break;
    default:
      *p++ = *s;
    }
  }
  if (p != publicId && p[-1] == 0x20)
    --p;
  *p = XML_T('\0');
}